

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O1

bool __thiscall DOMTest::testEntity(DOMTest *this,DOMDocument *document)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  DOMNode *pDVar4;
  wchar16 *pwVar5;
  wchar16 *pwVar6;
  long lVar7;
  DOMDocument *pDVar8;
  DOMNode *pDVar9;
  DOMNode *pDVar10;
  XMLCh *pXVar11;
  DOMDocument *pDVar12;
  bool bVar13;
  
  xercesc_4_0::XMLString::transcode
            ("ourEntityNode",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)(**(code **)(*(long *)document + 0x58))(document);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x148))(plVar3);
  pDVar4 = (DOMNode *)(**(code **)(*plVar3 + 0x20))(plVar3,tempStr);
  plVar3 = (long *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x10))(pDVar4);
  pwVar6 = (wchar16 *)(**(code **)(*plVar3 + 0x10))(plVar3);
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar5,pwVar6);
  if (((iVar2 == 0) && (lVar7 = (**(code **)(*(long *)pDVar4 + 0x18))(pDVar4), lVar7 != 0)) &&
     (lVar7 = (**(code **)(*plVar3 + 0x18))(plVar3), lVar7 != 0)) {
    pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x18))(pDVar4);
    pwVar6 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar5,pwVar6);
    bVar13 = true;
    if (iVar2 == 0) goto LAB_0011d1fd;
  }
  else {
    lVar7 = (**(code **)(*(long *)pDVar4 + 0x18))(pDVar4);
    if (lVar7 == 0) {
      lVar7 = (**(code **)(*plVar3 + 0x18))(plVar3);
      bVar13 = true;
      if (lVar7 == 0) goto LAB_0011d1fd;
    }
  }
  testEntity();
  bVar13 = false;
LAB_0011d1fd:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,0);
  pDVar8 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar8 != document) {
    testEntity();
    bVar13 = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,pDVar4,0);
  pDVar9 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pDVar4 != pDVar9) {
    testEntity();
    bVar13 = false;
  }
  pDVar9 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,tempStr2,0);
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pDVar10 != (DOMNode *)tempStr2) {
    testEntity();
    bVar13 = false;
  }
  if (pDVar4 != pDVar9) {
    testEntity();
    bVar13 = false;
  }
  if (pDVar4 == pDVar10) {
    testEntity();
    bVar13 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar7 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr3);
  if (lVar7 != 0) {
    testEntity();
    bVar13 = false;
  }
  lVar7 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (lVar7 != 0) {
    testEntity();
    bVar13 = false;
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,0,0);
  lVar7 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar11 != tempStr2) {
    testEntity();
    bVar13 = false;
  }
  if (lVar7 != 0) {
    testEntity();
    bVar13 = false;
  }
  pDVar12 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,0,0);
  lVar7 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar8 != pDVar12) {
    testEntity();
    bVar13 = false;
  }
  if (lVar7 != 0) {
    testEntity();
    bVar13 = false;
  }
  lVar7 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (lVar7 != 0) {
    testEntity();
    bVar13 = false;
  }
  lVar7 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (lVar7 != 0) {
    testEntity();
    bVar13 = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,&userhandler);
  pDVar9 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  if (userhandler.currentType != NODE_CLONED) {
    testEntity();
    bVar13 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testEntity();
    bVar13 = false;
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    testEntity();
    bVar13 = false;
  }
  if (userhandler.currentSrc != pDVar4) {
    testEntity();
    bVar13 = false;
  }
  if (userhandler.currentDst != pDVar9) {
    testEntity();
    bVar13 = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar10 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar4,1);
  if (userhandler.currentType != NODE_IMPORTED) {
    testEntity();
    bVar13 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testEntity();
    bVar13 = false;
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    testEntity();
    bVar13 = false;
  }
  if (userhandler.currentSrc != pDVar4) {
    testEntity();
    bVar13 = false;
  }
  if (userhandler.currentDst != pDVar10) {
    testEntity();
    bVar13 = false;
  }
  (**(code **)(*(long *)pDVar10 + 0xe8))(pDVar10,tempStr2,pDVar4,&userhandler);
  (**(code **)(*(long *)pDVar10 + 0x138))(pDVar10);
  if (userhandler.currentType != NODE_DELETED) {
    testEntity();
    bVar13 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testEntity();
    bVar13 = false;
  }
  if ((DOMNode *)userhandler.currentData != pDVar4) {
    testEntity();
    bVar13 = false;
  }
  if (userhandler.currentSrc != (DOMNode *)0x0) {
    testEntity();
    bVar13 = false;
  }
  if (userhandler.currentDst != (DOMNode *)0x0) {
    testEntity();
    bVar13 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    testEntity();
    bVar13 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  if (cVar1 != '\0') {
    testEntity();
    bVar13 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar9);
  if (cVar1 == '\0') {
    testEntity();
    bVar13 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    testEntity();
    bVar13 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  if (cVar1 != '\0') {
    testEntity();
    bVar13 = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar4,0,tempStr2);
  testEntity();
  if (bVar13 == false) {
    puts("\n*****The DOMEntity* method calls listed above failed, all others worked correctly.*****"
        );
  }
  return bVar13;
}

Assistant:

bool DOMTest::testEntity(DOMDocument* document)
{
    DOMEntity* entity;
    DOMNode* node, *node2;
    bool OK = true;
// For debugging*****   printf("\n          testEntity's outputs:\n\n");
    XMLString::transcode("ourEntityNode", tempStr, 3999);
    DOMNode*  abc20 = document->getDoctype()->getEntities()->getNamedItem(tempStr);
    entity = (DOMEntity*) abc20;
    node = entity;
    node2 = entity->cloneNode(true);
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(node->getNodeName(), node2->getNodeName()) &&        // Compares node names for equality
          (node->getNodeValue() != 0 && node2->getNodeValue() != 0)     // Checks to make sure each node has a value node
        ? !XMLString::compareString(node->getNodeValue(), node2->getNodeValue())         // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && node2->getNodeValue() == 0)))   // If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMEntity* node correctly");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument

    // Test the user data
    // Test simple set and get
    DOMEntity* userTest = entity;
    DOMNode*  userFirst = node;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(userFirst)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 210 );

    if (!OK)
        printf("\n*****The DOMEntity* method calls listed above failed, all others worked correctly.*****\n");
    return OK;
}